

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_sequencer.h
# Opt level: O1

bool __thiscall draco::LinearSequencer::GenerateSequenceInternal(LinearSequencer *this)

{
  int iVar1;
  int iVar2;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *pvVar3;
  pointer pIVar4;
  pointer pIVar5;
  long lVar6;
  
  iVar1 = this->num_points_;
  if (-1 < (long)iVar1) {
    std::
    vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
    ::resize((this->super_PointsSequencer).out_point_ids_,(long)iVar1);
    iVar2 = this->num_points_;
    if (0 < (long)iVar2) {
      pvVar3 = (this->super_PointsSequencer).out_point_ids_;
      pIVar4 = (pvVar3->
               super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pIVar5 = (pvVar3->
               super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = 0;
      do {
        if ((long)pIVar5 - (long)pIVar4 >> 2 == lVar6) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        pIVar4[lVar6].value_ = (uint)lVar6;
        lVar6 = lVar6 + 1;
      } while (iVar2 != lVar6);
    }
  }
  return -1 < iVar1;
}

Assistant:

bool GenerateSequenceInternal() override {
    if (num_points_ < 0) {
      return false;
    }
    out_point_ids()->resize(num_points_);
    for (int i = 0; i < num_points_; ++i) {
      out_point_ids()->at(i) = PointIndex(i);
    }
    return true;
  }